

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageinput.cc
# Opt level: O0

void __thiscall
ImageInput::readScanline
          (ImageInput *this,void *pBufferOut,size_t bufferByteCount,uint32_t y,uint32_t z,
          uint32_t subimage,uint32_t miplevel,FormatDescriptor *format)

{
  bool bVar1;
  uchar uVar2;
  uchar maxw;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint *puVar7;
  runtime_error *prVar8;
  const_reference pvVar9;
  ulong uVar10;
  size_t sVar11;
  undefined8 uVar12;
  ImageSpec *pIVar13;
  size_type sVar14;
  ImageSpec *this_00;
  undefined4 in_ECX;
  ulong in_RDX;
  ImageSpec *in_RSI;
  v10 *this_01;
  long *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined4 in_stack_00000008;
  FormatDescriptor *in_stack_00000010;
  uint8_t *pNativeBuffer;
  size_t imageByteCount;
  bool targetF;
  bool targetS;
  bool targetE;
  bool targetL;
  uint requestBits;
  uint32_t targetBitLength;
  FormatDescriptor *targetFormat;
  undefined4 in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc0c;
  ImageSpec *in_stack_fffffffffffffc10;
  unsigned_short in_stack_fffffffffffffc1e;
  unsigned_short *in_stack_fffffffffffffc20;
  undefined6 in_stack_fffffffffffffc28;
  undefined1 in_stack_fffffffffffffc2e;
  uchar in_stack_fffffffffffffc2f;
  FormatDescriptor *in_stack_fffffffffffffc30;
  FormatDescriptor *in_stack_fffffffffffffc40;
  FormatDescriptor *local_2e8;
  ImageSpec *local_2d8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0 [2];
  string local_290 [39];
  byte local_269;
  byte local_268;
  byte local_267;
  byte local_266;
  undefined1 local_265;
  char *local_258 [2];
  string local_248 [32];
  undefined4 local_228;
  uint local_224;
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  local_220;
  undefined4 local_20c;
  undefined4 local_208;
  undefined4 local_204;
  ulong local_200;
  ImageSpec *local_1f8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_1e8 [2];
  undefined8 local_1d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_1d0;
  char *local_1c8;
  size_t local_1c0;
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  *local_1b8;
  char *local_1b0;
  size_t sStack_1a8;
  string *local_1a0;
  char *local_198;
  char **local_190;
  format_args in_stack_fffffffffffffe78;
  string_view in_stack_fffffffffffffe88;
  undefined8 local_130;
  undefined1 *local_128;
  char *local_120;
  size_t local_118;
  char **local_110;
  char **local_108;
  char **local_100;
  char **local_f8;
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  *local_f0;
  char *local_e8;
  size_t sStack_e0;
  string *local_d8;
  char *local_d0;
  char **local_c8;
  char *local_c0;
  char **local_b8;
  char *local_b0;
  char **local_a8;
  char **local_a0;
  char *local_98;
  size_t sStack_90;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_88;
  undefined8 *local_80;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_78;
  undefined8 local_70;
  undefined8 *local_68;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_60;
  char *local_58;
  char **local_50;
  char *local_48;
  size_t sStack_40;
  undefined1 *local_38;
  undefined8 *local_30;
  undefined1 *local_28;
  undefined8 local_20;
  undefined8 *local_18;
  undefined1 *local_10;
  char *local_8;
  
  local_20c = in_R9D;
  local_208 = in_R8D;
  local_204 = in_ECX;
  local_200 = in_RDX;
  local_1f8 = in_RSI;
  bVar1 = FormatDescriptor::isUnknown((FormatDescriptor *)0x2f0c62);
  if (bVar1) {
    pIVar13 = (ImageSpec *)(**(code **)(*in_RDI + 0x70))();
    local_2e8 = ImageSpec::format(pIVar13);
  }
  else {
    local_2e8 = in_stack_00000010;
  }
  local_220.string.size = (size_t)local_2e8;
  local_220.ulong_long_value._4_4_ =
       FormatDescriptor::largestChannelBitLength(in_stack_fffffffffffffc40);
  local_224 = imageio::bit_ceil<unsigned_int>(local_220.ulong_long_value._4_4_);
  local_228 = 8;
  this_01 = (v10 *)&local_228;
  puVar7 = std::max<unsigned_int>(&local_224,(uint *)this_01);
  local_220.uint_value = *puVar7;
  if ((local_220.int_value != 8) && (local_220.int_value != 0x10)) {
    local_265 = 1;
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_190 = local_258;
    local_198 = "Requested decode into {}-bit format is not supported.";
    local_b0 = "Requested decode into {}-bit format is not supported.";
    local_258[0] = "Requested decode into {}-bit format is not supported.";
    local_a8 = local_190;
    local_1c0 = std::char_traits<char>::length((char_type *)0x2f0d99);
    local_58 = local_198;
    local_1a0 = local_248;
    local_1b0 = local_258[0];
    local_1b8 = &local_220;
    local_a0 = &local_1b0;
    local_1c8 = local_258[0];
    sStack_1a8 = local_1c0;
    local_98 = local_1c8;
    sStack_90 = local_1c0;
    local_1e8[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int_const>
                             ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
                               *)&local_1b8->string,this_01,(uint *)local_1a0);
    local_80 = &local_1d8;
    local_88 = local_1e8;
    local_70 = 2;
    local_1d8 = 2;
    local_78 = local_88;
    local_68 = local_80;
    local_60 = local_88;
    local_1d0 = local_88;
    ::fmt::v10::vformat_abi_cxx11_(in_stack_fffffffffffffe88,in_stack_fffffffffffffe78);
    std::runtime_error::runtime_error(prVar8,local_248);
    local_265 = 0;
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar9 = std::vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>::
           operator[]((vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_> *
                      )(local_220.custom.format + 0x58),0);
  local_266 = (*(ulong *)pvVar9 >> 0x1c & 1) != 0;
  pvVar9 = std::vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>::
           operator[]((vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_> *
                      )(local_220.custom.format + 0x58),0);
  local_267 = (*(ulong *)pvVar9 >> 0x1d & 1) != 0;
  pvVar9 = std::vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>::
           operator[]((vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_> *
                      )(local_220.custom.format + 0x58),0);
  local_268 = (*(ulong *)pvVar9 >> 0x1e & 1) != 0;
  pvVar9 = std::vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>::
           operator[]((vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_> *
                      )(local_220.custom.format + 0x58),0);
  local_269 = (*(ulong *)pvVar9 >> 0x1f & 1) != 0;
  if (((((local_267 & 1) == 0) && ((local_266 & 1) == 0)) && ((local_268 & 1) == 0)) &&
     (!(bool)local_269)) {
    (**(code **)(*in_RDI + 0xb0))(in_RDI,local_20c,in_stack_00000008);
    uVar10 = (ulong)local_220.uint_value;
    (**(code **)(*in_RDI + 0x70))();
    sVar11 = ImageSpec::imageChannelCount(in_stack_fffffffffffffc10);
    if (local_200 <= uVar10 * sVar11 >> 3) {
      uVar3 = FormatDescriptor::channelBitLength
                        ((FormatDescriptor *)
                         CONCAT17(in_stack_fffffffffffffc2f,
                                  CONCAT16(in_stack_fffffffffffffc2e,in_stack_fffffffffffffc28)));
      pIVar13 = (ImageSpec *)(**(code **)(*in_RDI + 0x70))();
      ImageSpec::format(pIVar13);
      uVar4 = FormatDescriptor::channelBitLength
                        ((FormatDescriptor *)
                         CONCAT17(in_stack_fffffffffffffc2f,
                                  CONCAT16(in_stack_fffffffffffffc2e,in_stack_fffffffffffffc28)));
      if (uVar3 == uVar4) {
        local_2d8 = local_1f8;
      }
      else {
        pIVar13 = (ImageSpec *)(**(code **)(*in_RDI + 0x70))();
        ImageSpec::format(pIVar13);
        uVar3 = FormatDescriptor::channelBitLength
                          ((FormatDescriptor *)
                           CONCAT17(in_stack_fffffffffffffc2f,
                                    CONCAT16(in_stack_fffffffffffffc2e,in_stack_fffffffffffffc28)));
        if (uVar3 == 0x10) {
          sVar14 = Imageio::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                             ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                              (in_RDI + 0x4c));
          (**(code **)(*in_RDI + 0x70))();
          sVar11 = ImageSpec::imageChannelCount(in_stack_fffffffffffffc10);
          if (sVar14 < sVar11) {
            (**(code **)(*in_RDI + 0x70))();
            ImageSpec::imageChannelCount(in_stack_fffffffffffffc10);
            Imageio::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                       in_stack_fffffffffffffc30,
                       CONCAT17(in_stack_fffffffffffffc2f,
                                CONCAT16(in_stack_fffffffffffffc2e,in_stack_fffffffffffffc28)));
          }
          local_2d8 = (ImageSpec *)
                      Imageio::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x2f15e8
                                );
          sVar14 = Imageio::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                             ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                              (in_RDI + 0x4c));
          local_200 = sVar14 << 1;
        }
        else {
          sVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              (in_RDI + 0x4f));
          (**(code **)(*in_RDI + 0x70))();
          sVar11 = ImageSpec::imageChannelCount(in_stack_fffffffffffffc10);
          if (sVar14 < sVar11) {
            (**(code **)(*in_RDI + 0x70))();
            ImageSpec::imageChannelCount(in_stack_fffffffffffffc10);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffc30,
                       CONCAT17(in_stack_fffffffffffffc2f,
                                CONCAT16(in_stack_fffffffffffffc2e,in_stack_fffffffffffffc28)));
          }
          local_2d8 = (ImageSpec *)
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2f16a1);
          local_200 = Imageio::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                 (in_RDI + 0x4c));
        }
      }
      (**(code **)(*in_RDI + 200))
                (in_RDI,local_2d8,local_200,local_204,local_208,local_20c,in_stack_00000008);
      pIVar13 = (ImageSpec *)
                Imageio::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x2f1743);
      if (local_2d8 == pIVar13) {
        FormatDescriptor::channelUpper(in_stack_fffffffffffffc30);
        Imageio::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x2f1789);
        pIVar13 = (ImageSpec *)(**(code **)(*in_RDI + 0x70))();
        ImageSpec::format(pIVar13);
        FormatDescriptor::channelUpper(in_stack_fffffffffffffc30);
        (**(code **)(*in_RDI + 0x70))();
        ImageSpec::imageChannelCount(in_stack_fffffffffffffc10);
        rescale<unsigned_short,unsigned_char>
                  ((uchar *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc2f,
                   in_stack_fffffffffffffc20,in_stack_fffffffffffffc1e,
                   (size_t)in_stack_fffffffffffffc10);
      }
      else {
        pIVar13 = (ImageSpec *)
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2f181a);
        if (local_2d8 == pIVar13) {
          FormatDescriptor::channelUpper(in_stack_fffffffffffffc30);
          uVar2 = (uchar)(in_stack_fffffffffffffc1e >> 8);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2f185e);
          pIVar13 = (ImageSpec *)(**(code **)(*in_RDI + 0x70))();
          ImageSpec::format(pIVar13);
          FormatDescriptor::channelUpper(in_stack_fffffffffffffc30);
          (**(code **)(*in_RDI + 0x70))();
          ImageSpec::imageChannelCount(in_stack_fffffffffffffc10);
          rescale<unsigned_char,unsigned_short>
                    ((unsigned_short *)in_stack_fffffffffffffc30,
                     CONCAT11(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc2e),
                     (uchar *)in_stack_fffffffffffffc20,uVar2,(size_t)in_stack_fffffffffffffc10);
        }
        else {
          uVar5 = FormatDescriptor::channelUpper(in_stack_fffffffffffffc30);
          pIVar13 = (ImageSpec *)(**(code **)(*in_RDI + 0x70))();
          ImageSpec::format(pIVar13);
          uVar6 = FormatDescriptor::channelUpper(in_stack_fffffffffffffc30);
          if (uVar5 != uVar6) {
            pIVar13 = (ImageSpec *)(**(code **)(*in_RDI + 0x70))();
            ImageSpec::format(pIVar13);
            uVar3 = FormatDescriptor::channelBitLength
                              ((FormatDescriptor *)
                               CONCAT17(in_stack_fffffffffffffc2f,
                                        CONCAT16(in_stack_fffffffffffffc2e,in_stack_fffffffffffffc28
                                                )));
            if (uVar3 == 0x10) {
              FormatDescriptor::channelUpper(&local_1f8->formatDesc);
              pIVar13 = (ImageSpec *)(**(code **)(*in_RDI + 0x70))();
              ImageSpec::format(pIVar13);
              FormatDescriptor::channelUpper(&local_1f8->formatDesc);
              (**(code **)(*in_RDI + 0x70))();
              ImageSpec::imageChannelCount(in_stack_fffffffffffffc10);
              rescale<unsigned_short,unsigned_short>
                        ((unsigned_short *)local_1f8,
                         CONCAT11(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc2e),
                         in_stack_fffffffffffffc20,in_stack_fffffffffffffc1e,
                         (size_t)in_stack_fffffffffffffc10);
            }
            else {
              pIVar13 = local_1f8;
              uVar5 = FormatDescriptor::channelUpper(in_stack_fffffffffffffc30);
              uVar2 = (uchar)uVar5;
              this_00 = (ImageSpec *)(**(code **)(*in_RDI + 0x70))();
              ImageSpec::format(this_00);
              uVar5 = FormatDescriptor::channelUpper(in_stack_fffffffffffffc30);
              maxw = (uchar)uVar5;
              (**(code **)(*in_RDI + 0x70))();
              ImageSpec::imageChannelCount(pIVar13);
              rescale<unsigned_char,unsigned_char>
                        ((uchar *)in_stack_fffffffffffffc30,maxw,(uchar *)local_1f8,uVar2,
                         (size_t)pIVar13);
            }
          }
        }
      }
      return;
    }
    uVar12 = __cxa_allocate_exception(0x10);
    buffer_too_small::buffer_too_small((buffer_too_small *)in_stack_fffffffffffffc10);
    __cxa_throw(uVar12,&buffer_too_small::typeinfo,buffer_too_small::~buffer_too_small);
  }
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_c8 = local_2a0;
  local_d0 = "Requested format conversion to {}-bit{}{}{}{} is not supported.";
  local_c0 = "Requested format conversion to {}-bit{}{}{}{} is not supported.";
  local_2a0[0] = "Requested format conversion to {}-bit{}{}{}{} is not supported.";
  local_b8 = local_c8;
  local_118 = std::char_traits<char>::length((char_type *)0x2f1135);
  local_8 = local_d0;
  local_2c0 = "";
  local_2a8 = "";
  if ((local_266 & 1) != 0) {
    local_2a8 = " Linear";
  }
  local_2b0 = "";
  if ((local_267 & 1) != 0) {
    local_2b0 = " Exponent";
  }
  local_2b8 = "";
  if ((local_268 & 1) != 0) {
    local_2b8 = " Signed";
  }
  if ((local_269 & 1) != 0) {
    local_2c0 = " Float";
  }
  local_d8 = local_290;
  local_e8 = local_2a0[0];
  local_f0 = &local_220;
  local_f8 = &local_2a8;
  local_100 = &local_2b0;
  local_108 = &local_2b8;
  local_110 = &local_2c0;
  local_50 = &local_e8;
  local_120 = local_2a0[0];
  sStack_e0 = local_118;
  local_48 = local_120;
  sStack_40 = local_118;
  ::fmt::v10::
  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int_const,char_const*,char_const*,char_const*,char_const*>
            ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
              *)&stack0xfffffffffffffe78,(v10 *)&local_f0->string,(uint *)local_f8,local_100,
             local_108,local_110,
             (char **)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
  local_30 = &local_130;
  local_38 = &stack0xfffffffffffffe78;
  local_20 = 0xcccc2;
  local_130 = 0xcccc2;
  local_28 = local_38;
  local_18 = local_30;
  local_10 = local_38;
  local_128 = local_38;
  ::fmt::v10::vformat_abi_cxx11_(in_stack_fffffffffffffe88,in_stack_fffffffffffffe78);
  std::runtime_error::runtime_error(prVar8,local_290);
  __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
ImageInput::readScanline(void* pBufferOut, size_t bufferByteCount,
                         uint32_t y, uint32_t z,
                         uint32_t subimage, uint32_t miplevel,
                         const FormatDescriptor& format)
{
    const auto& targetFormat = format.isUnknown() ? spec().format() : format;

    const auto targetBitLength = targetFormat.largestChannelBitLength();
    const auto requestBits = std::max(imageio::bit_ceil(targetBitLength), 8u);

    if (requestBits != 8 && requestBits != 16)
        throw std::runtime_error(fmt::format(
                "Requested decode into {}-bit format is not supported.",
                requestBits)
              );

    const bool targetL = targetFormat.samples[0].qualifierLinear;
    const bool targetE = targetFormat.samples[0].qualifierExponent;
    const bool targetS = targetFormat.samples[0].qualifierSigned;
    const bool targetF = targetFormat.samples[0].qualifierFloat;

    // Only UNORM requests are supported here.
    if (targetE || targetL || targetS || targetF)
        throw std::runtime_error(fmt::format(
                "Requested format conversion to {}-bit{}{}{}{} is not supported.",
                requestBits,
                targetL ? " Linear" : "",
                targetE ? " Exponent" : "",
                targetS ? " Signed" : "",
                targetF ? " Float" : "")
              );

    seekSubimage(subimage, miplevel);

    size_t imageByteCount = (requestBits * spec().imageChannelCount()) / 8;
    if (imageByteCount < bufferByteCount)
        throw buffer_too_small();

    uint8_t* pNativeBuffer;
    if (targetFormat.channelBitLength() != spec().format().channelBitLength()) {
        if (spec().format().channelBitLength() == 16) {
            if (nativeBuffer16.size() < spec().imageChannelCount())
                nativeBuffer16.resize(spec().imageChannelCount());
            pNativeBuffer = reinterpret_cast<uint8_t*>(nativeBuffer16.data());
            bufferByteCount = nativeBuffer16.size() * sizeof(uint16_t);
        } else {
            if (nativeBuffer8.size() < spec().imageChannelCount())
                nativeBuffer8.resize(spec().imageChannelCount());
            pNativeBuffer = nativeBuffer8.data();
            bufferByteCount = nativeBuffer16.size() * sizeof(uint8_t);
        }
    } else {
        pNativeBuffer = static_cast<uint8_t*>(pBufferOut);
    }

    readNativeScanline(pNativeBuffer, bufferByteCount, y, z, subimage, miplevel);

    if (reinterpret_cast<uint16_t*>(pNativeBuffer) == nativeBuffer16.data()) {
         rescale(static_cast<uint8_t*>(pBufferOut),
                 static_cast<uint8_t>(targetFormat.channelUpper()),
                 nativeBuffer16.data(),
                 static_cast<uint16_t>(spec().format().channelUpper()),
                 spec().imageChannelCount());
    } else if (pNativeBuffer == nativeBuffer8.data()) {
         rescale(static_cast<uint16_t*>(pBufferOut),
                 static_cast<uint16_t>(targetFormat.channelUpper()),
                 nativeBuffer8.data(),
                 static_cast<uint8_t>(spec().format().channelUpper()),
                 spec().imageChannelCount());
    } else if (targetFormat.channelUpper() != spec().format().channelUpper()) {
        if (spec().format().channelBitLength() == 16) {
            rescale(static_cast<uint16_t*>(pBufferOut),
                    static_cast<uint16_t>(targetFormat.channelUpper()),
                    static_cast<uint16_t*>(pBufferOut),
                    static_cast<uint16_t>(spec().format().channelUpper()),
                    spec().imageChannelCount());
        } else {
            rescale(static_cast<uint8_t*>(pBufferOut),
                    static_cast<uint8_t>(targetFormat.channelUpper()),
                    static_cast<uint8_t*>(pBufferOut),
                    static_cast<uint8_t>(spec().format().channelUpper()),
                    spec().imageChannelCount());
        }
    }
}